

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O3

void __thiscall
SwitchIRBuilder::BuildEmptyCasesInstr(SwitchIRBuilder *this,CaseNode *caseNode,uint32 fallThrOffset)

{
  Opnd *src1Opnd;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BranchInstr *pBVar4;
  Opnd *src2Opnd;
  
  src2Opnd = caseNode->lowerBound;
  src1Opnd = (caseNode->caseInstr->super_Instr).m_src1;
  if (src2Opnd == (caseNode->caseInstr->super_Instr).m_src2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                       ,0x1b4,"(caseNode->GetLowerBound() != caseNode->GetUpperBound())",
                       "The upper bound and lower bound should not be the same");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    src2Opnd = caseNode->lowerBound;
  }
  pBVar4 = IR::BranchInstr::New(this->m_ltOp,(LabelInstr *)0x0,src1Opnd,src2Opnd,this->m_func);
  pBVar4->field_0x58 = pBVar4->field_0x58 | 2;
  (**this->m_adapter->_vptr_SwitchAdapter)
            (this->m_adapter,pBVar4,(ulong)caseNode->offset,(ulong)fallThrOffset,1);
  pBVar4 = IR::BranchInstr::New
                     (this->m_leOp,(LabelInstr *)0x0,src1Opnd,
                      (caseNode->caseInstr->super_Instr).m_src2,this->m_func);
  pBVar4->field_0x58 = pBVar4->field_0x58 | 2;
  (**this->m_adapter->_vptr_SwitchAdapter)
            (this->m_adapter,pBVar4,(ulong)caseNode->offset,(ulong)caseNode->targetOffset,1);
  BuildBailOnNotInteger(this);
  return;
}

Assistant:

void
SwitchIRBuilder::BuildEmptyCasesInstr(CaseNode* caseNode, uint32 fallThrOffset)
{
    IR::BranchInstr* branchInstr;
    IR::Opnd* src1Opnd;

    src1Opnd = caseNode->GetCaseInstr()->GetSrc1();

    AssertMsg(caseNode->GetLowerBound() != caseNode->GetUpperBound(), "The upper bound and lower bound should not be the same");

    //Generate <lb instruction
    branchInstr = IR::BranchInstr::New(m_ltOp, nullptr, src1Opnd, caseNode->GetLowerBound(), m_func);
    branchInstr->m_isSwitchBr = true;
    m_adapter->AddBranchInstr(branchInstr, caseNode->GetOffset(), fallThrOffset, true);

    //Generate <=ub instruction
    branchInstr = IR::BranchInstr::New(m_leOp, nullptr, src1Opnd, caseNode->GetUpperBound(), m_func);
    branchInstr->m_isSwitchBr = true;
    m_adapter->AddBranchInstr(branchInstr, caseNode->GetOffset(), caseNode->GetTargetOffset(), true);

    BuildBailOnNotInteger();
}